

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O3

iterator __thiscall
fmt::v10::formatter<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>,char,void>::
format<fmt::v10::basic_format_context<fmt::v10::appender,char>>
          (formatter<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>,char,void> *this,
          Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *m,
          basic_format_context<fmt::v10::appender,_char> *ctx)

{
  size_type *this_00;
  int _precision;
  appender __result;
  ActualDstType actualDst;
  string local_448;
  string local_428;
  basic_format_context<fmt::v10::appender,_char> *local_408;
  string local_400;
  string local_3e0;
  string local_3c0;
  __string_type str;
  stringstream ss;
  ostream local_298 [112];
  ios_base local_228 [264];
  IOFormat format;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  _precision = *(int *)this;
  str._M_dataplus._M_p = (pointer)&str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&str,", ","");
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"\n","");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"[","");
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"]","");
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_408 = ctx;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"");
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c0,"");
  Eigen::IOFormat::IOFormat
            (&format,_precision,0,&str,&local_448,&local_428,&local_3e0,&local_400,&local_3c0,' ');
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p,local_3c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p,local_428.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p,local_448.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  str._M_dataplus._M_p = (pointer)m->m_matrix;
  this_00 = &str._M_string_length;
  Eigen::IOFormat::IOFormat((IOFormat *)this_00,&format);
  local_448._M_dataplus._M_p = *str._M_dataplus._M_p;
  local_448._M_string_length = *(size_type *)(str._M_dataplus._M_p + 8);
  Eigen::internal::print_matrix<Eigen::Matrix<double,1,2,1,1,2>>
            (local_298,(Matrix<double,_1,_2,_1,_1,_2> *)&local_448,(IOFormat *)this_00);
  Eigen::IOFormat::~IOFormat((IOFormat *)this_00);
  __result.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
       (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
       (local_408->out_).super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
  std::__cxx11::stringbuf::str();
  std::__copy_move<false,false,std::random_access_iterator_tag>::__copy_m<char*,fmt::v10::appender>
            (str._M_dataplus._M_p,str._M_dataplus._M_p + str._M_string_length,__result);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)str._M_dataplus._M_p != &str.field_2) {
    operator_delete(str._M_dataplus._M_p,str.field_2._M_allocated_capacity + 1);
  }
  Eigen::IOFormat::~IOFormat(&format);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::ios_base::~ios_base(local_228);
  return (iterator)
         (buffer<char> *)
         __result.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
}

Assistant:

auto format(const MATRIX& m, FormatContext& ctx) const {
    std::stringstream ss;  // NOLINT(misc-const-correctness)
    const Eigen::IOFormat format(precision, 0, ", ", "\n", "[", "]");
    ss << m.format(format);

    auto it = ctx.out();
    auto str = ss.str();
    std::copy(str.begin(), str.end(), it);
    return it;
  }